

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O1

MPP_RET mpp_buf_slot_enqueue(MppBufSlots slots,RK_S32 index,SlotQueueType type)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 in_RAX;
  long *plVar4;
  MPP_RET MVar5;
  undefined4 uVar6;
  
  uVar6 = (undefined4)((ulong)in_RAX >> 0x20);
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_enqueue");
    MVar5 = MPP_ERR_NULL_PTR;
  }
  else {
    __mutex = *slots;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    if ((index < 0) || (*(int *)((long)slots + 0x60) <= index)) {
      _dump_slots("mpp_buf_slot_enqueue",(MppBufSlotsImpl *)slots);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(index >= 0) && (index < impl->buf_count)","mpp_buf_slot_enqueue",
                 CONCAT44(uVar6,0x43d));
      abort();
    }
    lVar1 = *(long *)((long)slots + 0xe8);
    slot_ops_with_log((MppBufSlotsImpl *)slots,
                      (MppBufSlotEntry *)(lVar1 + (ulong)(uint)index * 0x38),type + 0xf,(void *)0x0)
    ;
    plVar4 = (long *)((ulong)(uint)index * 0x38 + 8 + lVar1);
    lVar1 = *plVar4;
    plVar2 = (long *)plVar4[1];
    *(long **)(lVar1 + 8) = plVar2;
    *plVar2 = lVar1;
    *plVar4 = (long)plVar4;
    plVar4[1] = (long)plVar4;
    lVar1 = (long)slots + (ulong)type * 0x10 + 0xa0;
    puVar3 = *(undefined8 **)(lVar1 + 8);
    *(long **)(lVar1 + 8) = plVar4;
    *plVar4 = lVar1;
    plVar4[1] = (long)puVar3;
    *puVar3 = plVar4;
    MVar5 = MPP_OK;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
      MVar5 = MPP_OK;
    }
  }
  return MVar5;
}

Assistant:

MPP_RET mpp_buf_slot_enqueue(MppBufSlots slots, RK_S32 index, SlotQueueType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (index >= 0) && (index < impl->buf_count));
    MppBufSlotEntry *slot = &impl->slots[index];
    slot_ops_with_log(impl, slot, (MppBufSlotOps)(SLOT_ENQUEUE + type), NULL);

    // add slot to display list
    list_del_init(&slot->list);
    list_add_tail(&slot->list, &impl->queue[type]);
    return MPP_OK;
}